

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

int prsgargs(prscxdef *ctx,prsndef *n)

{
  prscxdef *in_RSI;
  int cnt;
  prsndef *in_stack_00000028;
  prscxdef *in_stack_00000030;
  uint in_stack_ffffffffffffffe8;
  int iVar1;
  
  iVar1 = 0;
  if ((*(int *)((long)&in_RSI->prscxerr + 4) == 2) && (*(int *)&in_RSI->prscxerr == 0x33)) {
    iVar1 = prsgargs(in_RSI,(prsndef *)(ulong)in_stack_ffffffffffffffe8);
    prsgexp(in_stack_00000030,in_stack_00000028);
  }
  else {
    prsgexp(in_stack_00000030,in_stack_00000028);
  }
  return iVar1 + 1;
}

Assistant:

static int prsgargs(prscxdef *ctx, prsndef *n)
{
    int cnt = 0;
    
    if (n->prsnnlf == 2 && n->prsntyp == TOKTRPAR)
    {
        cnt = prsgargs(ctx, n->prsnv.prsnvn[1]);
        prsgexp(ctx, n->prsnv.prsnvn[0]);
    }
    else
        prsgexp(ctx, n);
    
    return(cnt + 1);
}